

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfFile.cpp
# Opt level: O3

void __thiscall
DirectiveLoadMipsElf::DirectiveLoadMipsElf(DirectiveLoadMipsElf *this,path *fileName)

{
  path *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  FileManager *this_02;
  _Alloc_hider _Var1;
  size_type sVar2;
  bool bVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_03;
  undefined1 local_59;
  shared_ptr<AssemblerFile> local_58;
  path local_48;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__DirectiveLoadMipsElf_001c2df8;
  (this->file).super___shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->file).super___shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &this->inputName;
  ghc::filesystem::path::path(this_00);
  ghc::filesystem::path::path(&this->outputName);
  local_48._path._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MipsElfFile,std::allocator<MipsElfFile>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._path._M_string_length,
             (MipsElfFile **)&local_48,(allocator<MipsElfFile> *)&local_59);
  sVar2 = local_48._path._M_string_length;
  _Var1._M_p = local_48._path._M_dataplus._M_p;
  local_48._path._M_dataplus._M_p = (pointer)0x0;
  local_48._path._M_string_length = 0;
  this_01 = (this->file).super___shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->file).super___shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_p;
  (this->file).super___shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._path._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._path._M_string_length);
    }
  }
  getFullPathName(&local_48,fileName);
  ghc::filesystem::path::operator=(this_00,&local_48);
  ghc::filesystem::path::~path(&local_48);
  bVar3 = MipsElfFile::load((this->file).super___shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,this_00,this_00);
  this_02 = g_fileManager;
  if (bVar3) {
    local_58.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &((this->file).super___shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_AssemblerFile;
    local_58.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->file).super___shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_58.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_58.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_58.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_58.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_58.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    FileManager::addFile(this_02,&local_58);
    this_03._M_pi =
         local_58.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    this_03._M_pi =
         (this->file).super___shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->file).super___shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->file).super___shared_ptr<MipsElfFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  if (this_03._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03._M_pi);
  }
  return;
}

Assistant:

DirectiveLoadMipsElf::DirectiveLoadMipsElf(const fs::path& fileName)
{
	file = std::make_shared<MipsElfFile>();

	this->inputName = getFullPathName(fileName);
	if (!file->load(this->inputName,this->inputName))
	{
		file = nullptr;
		return;
	}
	
	g_fileManager->addFile(file);
}